

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [29])

{
  stringstream *this_00;
  size_t sVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  
  this_00 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_00);
  *(undefined8 *)(this_00 + 0x18 + *(long *)(*(long *)(this_00 + 0x10) + -0x18)) = 0x11;
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00;
  sVar1 = strlen(*value);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(this_00 + 0x10),*value,sVar1);
  AppendMessage(this,(Message *)&local_30);
  if (local_30._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_30._M_head_impl + 8))();
  }
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }